

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O2

uint16_t labpack_read_u16(labpack_reader_t *reader)

{
  uint16_t uVar1;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      uVar1 = mpack_expect_u16(reader->decoder);
      labpack_reader_check_decoder(reader);
    }
    else {
      uVar1 = 0;
    }
    return uVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0xa0,"uint16_t labpack_read_u16(labpack_reader_t *)");
}

Assistant:

uint16_t
labpack_read_u16(labpack_reader_t* reader)
{
    assert(reader);
    uint16_t value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_u16(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}